

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::WriteTo
          (Node *this,ObjectWriter *ow)

{
  NodeKind NVar1;
  DataPiece *data;
  char *size;
  pointer pcVar2;
  size_t sVar3;
  pointer ppNVar4;
  ObjectWriter *in_R8;
  ulong uVar5;
  StringPiece name;
  
  NVar1 = this->kind_;
  if (NVar1 == MAP) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    sVar3 = (this->name_)._M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    (*ow->_vptr_ObjectWriter[2])(ow,pcVar2,sVar3);
    ppNVar4 = (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->children_).
        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppNVar4) {
      uVar5 = 0;
      do {
        (*ppNVar4[uVar5]->_vptr_Node[3])(ppNVar4[uVar5],ow);
        uVar5 = uVar5 + 1;
        ppNVar4 = (this->children_).
                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->children_).
                                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3
                              ));
    }
LAB_003087b3:
    (*ow->_vptr_ObjectWriter[3])(ow);
    return;
  }
  if (NVar1 == LIST) {
    if ((this->suppress_empty_list_ != true) || (this->is_placeholder_ == false)) {
      pcVar2 = (this->name_)._M_dataplus._M_p;
      sVar3 = (this->name_)._M_string_length;
      if ((long)sVar3 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
      }
      (*ow->_vptr_ObjectWriter[4])(ow,pcVar2,sVar3);
      ppNVar4 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->children_).
          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppNVar4) {
        uVar5 = 0;
        do {
          (*ppNVar4[uVar5]->_vptr_Node[3])(ppNVar4[uVar5],ow);
          uVar5 = uVar5 + 1;
          ppNVar4 = (this->children_).
                    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)(this->children_).
                                       super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >>
                                3));
      }
      (*ow->_vptr_ObjectWriter[5])(ow);
      return;
    }
  }
  else {
    if (NVar1 == PRIMITIVE) {
      data = (DataPiece *)(this->name_)._M_dataplus._M_p;
      size = (char *)(this->name_)._M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      name.length_ = (stringpiece_ssize_type)ow;
      name.ptr_ = size;
      ObjectWriter::RenderDataPieceTo((ObjectWriter *)&this->data_,data,name,in_R8);
      return;
    }
    if (this->is_placeholder_ == false) {
      pcVar2 = (this->name_)._M_dataplus._M_p;
      sVar3 = (this->name_)._M_string_length;
      if ((long)sVar3 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
      }
      (*ow->_vptr_ObjectWriter[2])(ow,pcVar2,sVar3);
      ppNVar4 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->children_).
          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppNVar4) {
        uVar5 = 0;
        do {
          (*ppNVar4[uVar5]->_vptr_Node[3])(ppNVar4[uVar5],ow);
          uVar5 = uVar5 + 1;
          ppNVar4 = (this->children_).
                    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)(this->children_).
                                       super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >>
                                3));
      }
      goto LAB_003087b3;
    }
  }
  return;
}

Assistant:

void DefaultValueObjectWriter::Node::WriteTo(ObjectWriter* ow) {
  if (kind_ == PRIMITIVE) {
    ObjectWriter::RenderDataPieceTo(data_, name_, ow);
    return;
  }

  // Render maps. Empty maps are rendered as "{}".
  if (kind_ == MAP) {
    ow->StartObject(name_);
    WriteChildren(ow);
    ow->EndObject();
    return;
  }

  // Write out lists. If we didn't have any list in response, write out empty
  // list.
  if (kind_ == LIST) {
    // Suppress empty lists if requested.
    if (suppress_empty_list_ && is_placeholder_) return;

    ow->StartList(name_);
    WriteChildren(ow);
    ow->EndList();
    return;
  }

  // If is_placeholder_ = true, we didn't see this node in the response, so
  // skip output.
  if (is_placeholder_) return;

  ow->StartObject(name_);
  WriteChildren(ow);
  ow->EndObject();
}